

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makePtrBoundsCheck<wasm::SIMDLoad>
          (Replacer *this,SIMDLoad *curr,Index ptrIdx,Index bytes)

{
  BinaryOp op;
  LocalGet *left;
  address64_t val;
  Const *pCVar1;
  Binary *leftOperand;
  Expression *pEVar2;
  Expression *boundsCheck;
  Index bytes_local;
  Index ptrIdx_local;
  SIMDLoad *curr_local;
  Replacer *this_local;
  
  op = Abstract::getBinary((Type)(this->parent->pointerType).id,Add);
  left = Builder::makeLocalGet(&this->builder,ptrIdx,(Type)(this->parent->pointerType).id);
  val = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
  pCVar1 = Builder::makeConstPtr(&this->builder,val,(Type)(this->parent->pointerType).id);
  leftOperand = Builder::makeBinary(&this->builder,op,(Expression *)left,(Expression *)pCVar1);
  pCVar1 = Builder::makeConstPtr(&this->builder,(ulong)bytes,(Type)(this->parent->pointerType).id);
  pEVar2 = makeAddGtuMemoryTrap
                     (this,(Expression *)leftOperand,(Expression *)pCVar1,
                      (Name)(curr->memory).super_IString.str);
  return pEVar2;
}

Assistant:

Expression* makePtrBoundsCheck(T* curr, Index ptrIdx, Index bytes) {
      Expression* boundsCheck = makeAddGtuMemoryTrap(
        builder.makeBinary(
          // ptr + offset (ea from wasm spec) + bit width
          Abstract::getBinary(parent.pointerType, Abstract::Add),
          builder.makeLocalGet(ptrIdx, parent.pointerType),
          builder.makeConstPtr(curr->offset, parent.pointerType)),
        builder.makeConstPtr(bytes, parent.pointerType),
        curr->memory);
      return boundsCheck;
    }